

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O0

void ask_user_lpar(NaStdBackPropParams *lpar)

{
  long in_RDI;
  NaReal NVar1;
  NaReal in_stack_00000010;
  char *in_stack_00000018;
  
  NVar1 = ask_user_real(in_stack_00000018,in_stack_00000010);
  *(NaReal *)(in_RDI + 8) = NVar1;
  NVar1 = ask_user_real(in_stack_00000018,in_stack_00000010);
  *(NaReal *)(in_RDI + 0x10) = NVar1;
  NVar1 = ask_user_real(in_stack_00000018,in_stack_00000010);
  *(NaReal *)(in_RDI + 0x18) = NVar1;
  NaPrintLog(*(char **)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x10),*(undefined8 *)(in_RDI + 0x18),
             "Learning parameters: lrate=%g  lrate(out)=%g  momentum=%g\n");
  return;
}

Assistant:

void
ask_user_lpar (NaStdBackPropParams& lpar)
{
    lpar.eta = ask_user_real("Learning rate (hidden layers)", lpar.eta);
    lpar.eta_output = ask_user_real("Learning rate (output layer)",
                               lpar.eta_output);
    lpar.alpha = ask_user_real("Momentum (inertia)", lpar.alpha);

    NaPrintLog("Learning parameters: lrate=%g  lrate(out)=%g  momentum=%g\n",
                lpar.eta, lpar.eta_output, lpar.alpha);
}